

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interface_var_sroa.h
# Opt level: O2

void __thiscall
spvtools::opt::InterfaceVariableScalarReplacement::InterfaceVariableScalarReplacement
          (InterfaceVariableScalarReplacement *this)

{
  Pass::Pass(&this->super_Pass);
  (this->super_Pass)._vptr_Pass = (_func_int **)&PTR__InterfaceVariableScalarReplacement_00a70020;
  (this->interface_vars_removed_from_entry_point_operands_)._M_h._M_buckets =
       &(this->interface_vars_removed_from_entry_point_operands_)._M_h._M_single_bucket;
  (this->interface_vars_removed_from_entry_point_operands_)._M_h._M_bucket_count = 1;
  (this->interface_vars_removed_from_entry_point_operands_)._M_h._M_before_begin._M_nxt =
       (_Hash_node_base *)0x0;
  (this->interface_vars_removed_from_entry_point_operands_)._M_h._M_element_count = 0;
  (this->interface_vars_removed_from_entry_point_operands_)._M_h._M_rehash_policy._M_max_load_factor
       = 1.0;
  (this->interface_vars_removed_from_entry_point_operands_)._M_h._M_rehash_policy._M_next_resize = 0
  ;
  (this->interface_vars_removed_from_entry_point_operands_)._M_h._M_single_bucket =
       (__node_base_ptr)0x0;
  (this->composite_ids_to_component_depths)._M_h._M_buckets =
       &(this->composite_ids_to_component_depths)._M_h._M_single_bucket;
  (this->composite_ids_to_component_depths)._M_h._M_bucket_count = 1;
  (this->composite_ids_to_component_depths)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->composite_ids_to_component_depths)._M_h._M_element_count = 0;
  (this->composite_ids_to_component_depths)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->composite_ids_to_component_depths)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->composite_ids_to_component_depths)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->vars_with_extra_arrayness)._M_h._M_buckets =
       &(this->vars_with_extra_arrayness)._M_h._M_single_bucket;
  (this->vars_with_extra_arrayness)._M_h._M_bucket_count = 1;
  (this->vars_with_extra_arrayness)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->vars_with_extra_arrayness)._M_h._M_element_count = 0;
  (this->vars_with_extra_arrayness)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->vars_with_extra_arrayness)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->vars_with_extra_arrayness)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->vars_without_extra_arrayness)._M_h._M_buckets =
       &(this->vars_without_extra_arrayness)._M_h._M_single_bucket;
  (this->vars_without_extra_arrayness)._M_h._M_bucket_count = 1;
  (this->vars_without_extra_arrayness)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->vars_without_extra_arrayness)._M_h._M_element_count = 0;
  (this->vars_without_extra_arrayness)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->vars_without_extra_arrayness)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->vars_without_extra_arrayness)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  return;
}

Assistant:

InterfaceVariableScalarReplacement() {}